

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket.hpp
# Opt level: O1

void __thiscall
asio::basic_socket<asio::ip::udp,_asio::any_io_executor>::basic_socket<asio::io_context>
          (basic_socket<asio::ip::udp,_asio::any_io_executor> *this,io_context *context,
          endpoint_type *endpoint,
          constraint_t<is_convertible<io_context_&,_execution_context_&>::value> param_3)

{
  implementation_type *impl;
  int af;
  error_code eVar1;
  error_code __ec;
  error_code __ec_00;
  error_code ec;
  system_error e;
  error_code local_58;
  system_error local_48 [32];
  
  detail::
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::udp>,_asio::any_io_executor>::
  io_object_impl<asio::io_context>(&this->impl_,0,0,context);
  local_58._M_value = 0;
  local_58._M_cat = (error_category *)std::_V2::system_category();
  af = (uint)((endpoint->impl_).data_.base.sa_family != 2) * 8 + 2;
  impl = &(this->impl_).implementation_;
  eVar1 = detail::reactive_socket_service_base::do_open
                    (&((this->impl_).service_)->super_reactive_socket_service_base,
                     &impl->super_base_implementation_type,af,2,0x11,&local_58);
  if (eVar1._M_value == 0) {
    (this->impl_).implementation_.protocol_.family_ = af;
  }
  __ec._4_4_ = 0;
  __ec._M_value = local_58._M_value;
  if (local_58._M_value != 0) {
    __ec._M_cat = local_58._M_cat;
    std::system_error::system_error(local_48,__ec,"open");
    detail::throw_exception<std::system_error>(local_48);
    std::system_error::~system_error(local_48);
  }
  detail::reactive_socket_service<asio::ip::udp>::bind
            ((this->impl_).service_,(int)impl,(sockaddr *)endpoint,(socklen_t)&local_58);
  __ec_00._4_4_ = 0;
  __ec_00._M_value = local_58._M_value;
  if (local_58._M_value != 0) {
    __ec_00._M_cat = local_58._M_cat;
    std::system_error::system_error(local_48,__ec_00,"bind");
    detail::throw_exception<std::system_error>(local_48);
    std::system_error::~system_error(local_48);
  }
  return;
}

Assistant:

basic_socket(ExecutionContext& context, const endpoint_type& endpoint,
      constraint_t<
        is_convertible<ExecutionContext&, execution_context&>::value
      > = 0)
    : impl_(0, 0, context)
  {
    asio::error_code ec;
    const protocol_type protocol = endpoint.protocol();
    impl_.get_service().open(impl_.get_implementation(), protocol, ec);
    asio::detail::throw_error(ec, "open");
    impl_.get_service().bind(impl_.get_implementation(), endpoint, ec);
    asio::detail::throw_error(ec, "bind");
  }